

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging_tests.c
# Opt level: O2

TestSuite * highly_nested_test_suite(void)

{
  TestSuite *pTVar1;
  TestSuite *pTVar2;
  int iVar3;
  bool bVar4;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("highly_nested_test_suite",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
                      ,0x14);
  add_test_(pTVar1,"highly_nested_test_suite_should_still_complete",
            &CgreenSpec__default__highly_nested_test_suite_should_still_complete__);
  iVar3 = 1000;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    pTVar2 = (TestSuite *)
             create_named_test_suite_
                       ("highly_nested_test_suite",
                        "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
                        ,0x17);
    add_suite_(pTVar2,"suite",pTVar1);
    pTVar1 = pTVar2;
  }
  return pTVar1;
}

Assistant:

TestSuite *highly_nested_test_suite(void) {
    int i;
    TestSuite *suite = create_test_suite();
    add_test(suite, highly_nested_test_suite_should_still_complete);
    for (i = 0; i < 1000; i++) {
        TestSuite *nesting = create_test_suite();
        add_suite(nesting, suite);
        suite = nesting;
    }
    return suite;
}